

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O3

bool __thiscall
tinyobj::ObjReader::ParseFromString
          (ObjReader *this,string *obj_text,string *mtl_text,ObjReaderConfig *config)

{
  long lVar1;
  undefined8 uVar2;
  ObjReader OVar3;
  MaterialStreamReader mtl_ss;
  stringbuf mtl_buf;
  locale local_2e8 [16];
  undefined1 *local_2d8;
  undefined1 local_2c8 [16];
  stringbuf obj_buf;
  locale local_280 [16];
  undefined1 *local_270;
  undefined1 local_260 [16];
  istream obj_ifs;
  ios_base local_240 [264];
  istream mtl_ifs;
  ios_base local_128 [264];
  
  std::__cxx11::stringbuf::stringbuf((stringbuf *)&obj_buf,(string *)obj_text,_S_out|_S_in);
  std::__cxx11::stringbuf::stringbuf((stringbuf *)&mtl_buf,(string *)mtl_text,_S_out|_S_in);
  std::istream::istream((istream *)&obj_ifs,(streambuf *)&obj_buf);
  std::istream::istream((istream *)&mtl_ifs,(streambuf *)&mtl_buf);
  mtl_ss.super_MaterialReader._vptr_MaterialReader = (_func_int **)&PTR__MaterialReader_00130d48;
  mtl_ss.m_inStream = &mtl_ifs;
  OVar3 = (ObjReader)
          LoadObj((attrib_t *)(this + 8),
                  (vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)(this + 0x98),
                  (vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)(this + 0xb0)
                  ,(string *)(this + 200),(string *)(this + 0xe8),&obj_ifs,
                  &mtl_ss.super_MaterialReader,(bool)*config,(bool)config[1]);
  *this = OVar3;
  uVar2 = __ITM_deregisterTMCloneTable;
  lVar1 = _VTT;
  _mtl_ifs = _VTT;
  *(undefined8 *)(&mtl_ifs + *(long *)(_VTT + -0x18)) = __ITM_deregisterTMCloneTable;
  std::ios_base::~ios_base(local_128);
  _obj_ifs = lVar1;
  *(undefined8 *)(&obj_ifs + *(long *)(lVar1 + -0x18)) = uVar2;
  std::ios_base::~ios_base(local_240);
  _mtl_buf = std::__cxx11::string::find_last_of;
  if (local_2d8 != local_2c8) {
    operator_delete(local_2d8);
  }
  _mtl_buf = calloc;
  std::locale::~locale(local_2e8);
  _obj_buf = std::__cxx11::string::find_last_of;
  if (local_270 != local_260) {
    operator_delete(local_270);
  }
  _obj_buf = calloc;
  std::locale::~locale(local_280);
  return (bool)OVar3;
}

Assistant:

bool ObjReader::ParseFromString(const std::string &obj_text,
                                const std::string &mtl_text,
                                const ObjReaderConfig &config) {
  std::stringbuf obj_buf(obj_text);
  std::stringbuf mtl_buf(mtl_text);

  std::istream obj_ifs(&obj_buf);
  std::istream mtl_ifs(&mtl_buf);

  MaterialStreamReader mtl_ss(mtl_ifs);

  valid_ = LoadObj(&attrib_, &shapes_, &materials_, &warning_, &error_,
                   &obj_ifs, &mtl_ss, config.triangulate, config.vertex_color);

  return valid_;
}